

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::read_content<httplib::Response>
               (Stream *strm,Response *x,size_t payload_max_length,int *status,Progress *progress,
               ContentReceiver *receiver)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  const_iterator cVar7;
  key_type *pkVar8;
  ContentReceiver *out_00;
  ulong uVar9;
  Headers *this;
  char *pcVar10;
  key_type *pkVar11;
  _Rb_tree_header *p_Var12;
  uint64_t r;
  key_type *pkVar13;
  ContentReceiver out;
  size_type __dnew;
  char buf [4096];
  key_type *local_1120;
  _Any_data local_1118;
  code *local_1108;
  code *pcStack_1100;
  key_type *local_10f0 [2];
  key_type local_10e0;
  int *local_10c0;
  _Any_data local_10b8;
  code *local_10a8;
  code *local_10a0;
  _Any_data local_1098;
  code *local_1088;
  code *local_1080;
  _Any_data local_1078;
  code *local_1068;
  code *local_1060;
  _Any_data local_1058;
  code *local_1048;
  key_type local_1038 [128];
  
  local_1118._8_8_ = 0;
  pcStack_1100 = std::
                 _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/httplib/httplib.h:1828:25)>
                 ::_M_invoke;
  local_1108 = std::
               _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/httplib/httplib.h:1828:25)>
               ::_M_manager;
  paVar1 = &local_1038[0].field_2;
  local_1118._M_unused._M_object = receiver;
  local_10e0.field_2._M_allocated_capacity = (size_type)progress;
  local_10c0 = status;
  local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"Content-Encoding","");
  this = &x->headers;
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this->_M_t,local_1038);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1038[0]._M_dataplus._M_p,
                    (ulong)(local_1038[0].field_2._M_allocated_capacity + 1));
  }
  p_Var12 = &(x->headers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar7._M_node == p_Var12) {
    pcVar10 = "";
  }
  else {
    pcVar10 = *(char **)(cVar7._M_node + 2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_10f0,pcVar10,(allocator<char> *)local_1038);
  local_10e0.field_2._8_8_ = payload_max_length;
  iVar5 = std::__cxx11::string::compare((char *)local_10f0);
  if (local_10f0[0] != &local_10e0) {
    operator_delete(local_10f0[0],(ulong)(local_10e0._M_dataplus._M_p + 1));
  }
  if (iVar5 == 0) {
    bVar3 = false;
    iVar5 = 0x19f;
  }
  else {
    local_10f0[0] = (key_type *)0x11;
    local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
    local_1038[0]._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)local_1038,(ulong)local_10f0);
    local_1038[0].field_2._M_allocated_capacity = local_10f0[0];
    *(undefined8 *)local_1038[0]._M_dataplus._M_p = 0x726566736e617254;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 8) = '-';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 9) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 10) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 0xb) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 0xc) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 0xd) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 0xe) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 0xf) = 'n';
    local_1038[0]._M_dataplus._M_p[0x10] = 'g';
    local_1038[0]._M_string_length = (size_type)local_10f0[0];
    local_1038[0]._M_dataplus._M_p[(long)local_10f0[0]] = '\0';
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this->_M_t,local_1038);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1038[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1038[0]._M_dataplus._M_p,
                      (ulong)(local_1038[0].field_2._M_allocated_capacity + 1));
    }
    if ((_Rb_tree_header *)cVar7._M_node == p_Var12) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)(cVar7._M_node + 2);
    }
    iVar5 = strcasecmp(pcVar10,"chunked");
    if (iVar5 == 0) {
      std::function<bool_(const_char_*,_unsigned_long)>::function
                ((function<bool_(const_char_*,_unsigned_long)> *)&local_1058,
                 (function<bool_(const_char_*,_unsigned_long)> *)&local_1118);
      bVar3 = read_content_chunked((detail *)strm,(Stream *)&local_1058,out_00);
      iVar5 = 400;
      if (local_1048 != (code *)0x0) {
        (*local_1048)(&local_1058,&local_1058,__destroy_functor);
      }
    }
    else {
      local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"Content-Length","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this->_M_t,local_1038);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1038[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1038[0]._M_dataplus._M_p,
                        (ulong)(local_1038[0].field_2._M_allocated_capacity + 1));
      }
      if ((_Rb_tree_header *)cVar7._M_node == p_Var12) {
        std::function<bool_(const_char_*,_unsigned_long)>::function
                  ((function<bool_(const_char_*,_unsigned_long)> *)&local_1078,
                   (function<bool_(const_char_*,_unsigned_long)> *)&local_1118);
        do {
          uVar6 = (*strm->_vptr_Stream[2])(strm,local_1038,0x1000);
          if ((int)uVar6 < 0) {
            this = (Headers *)0x0;
LAB_00163dbe:
            bVar4 = false;
          }
          else {
            if (uVar6 == 0) {
              this = (Headers *)0x1;
              goto LAB_00163dbe;
            }
            local_1120 = (key_type *)(ulong)uVar6;
            local_10f0[0] = local_1038;
            if (local_1068 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            bVar4 = (*local_1060)(&local_1078,(char **)local_10f0,(unsigned_long *)&local_1120);
            this = (Headers *)(ulong)((byte)this & bVar4);
          }
          bVar3 = SUB81(this,0);
        } while (bVar4 != false);
        iVar5 = 400;
        if (local_1068 != (code *)0x0) {
          (*local_1068)(&local_1078,&local_1078,__destroy_functor);
        }
      }
      else {
        local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"Content-Length","");
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&this->_M_t,local_1038);
        uVar2 = local_10e0.field_2._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1038[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1038[0]._M_dataplus._M_p,
                          (ulong)(local_1038[0].field_2._M_allocated_capacity + 1));
        }
        if ((_Rb_tree_header *)cVar7._M_node == p_Var12) {
          pkVar8 = (key_type *)0x0;
        }
        else {
          pkVar8 = (key_type *)strtoull(*(char **)(cVar7._M_node + 2),(char **)0x0,10);
        }
        if ((ulong)uVar2 < pkVar8) {
          pkVar13 = (key_type *)0x0;
          do {
            uVar9 = (long)pkVar8 - (long)pkVar13;
            if (pkVar8 < pkVar13 || uVar9 == 0) break;
            if (0xfff < uVar9) {
              uVar9 = 0x1000;
            }
            uVar6 = (*strm->_vptr_Stream[2])(strm,local_1038,uVar9);
            uVar9 = 0;
            if (0 < (int)uVar6) {
              uVar9 = (ulong)uVar6;
            }
            pkVar13 = (key_type *)((long)&(pkVar13->_M_dataplus)._M_p + uVar9);
          } while (0 < (int)uVar6);
          iVar5 = 0x19d;
          bVar3 = false;
        }
        else {
          iVar5 = 400;
          if (pkVar8 == (key_type *)0x0) {
            bVar3 = true;
          }
          else {
            std::function<bool_(unsigned_long,_unsigned_long)>::function
                      ((function<bool_(unsigned_long,_unsigned_long)> *)&local_1098,
                       (function<bool_(unsigned_long,_unsigned_long)> *)
                       local_10e0.field_2._M_allocated_capacity);
            std::function<bool_(const_char_*,_unsigned_long)>::function
                      ((function<bool_(const_char_*,_unsigned_long)> *)&local_10b8,
                       (function<bool_(const_char_*,_unsigned_long)> *)&local_1118);
            pkVar13 = (key_type *)0x0;
            do {
              uVar9 = (long)pkVar8 - (long)pkVar13;
              bVar3 = pkVar8 < pkVar13 || uVar9 == 0;
              if (pkVar8 < pkVar13 || uVar9 == 0) break;
              if (0xfff < uVar9) {
                uVar9 = 0x1000;
              }
              uVar6 = (*strm->_vptr_Stream[2])(strm,local_1038,uVar9);
              if ((int)uVar6 < 1) {
LAB_00163f1c:
                bVar4 = false;
              }
              else {
                pkVar11 = (key_type *)(ulong)uVar6;
                local_10f0[0] = local_1038;
                local_1120 = pkVar11;
                if (local_10a8 == (code *)0x0) {
                  std::__throw_bad_function_call();
                }
                bVar4 = (*local_10a0)(&local_10b8,(char **)local_10f0,(unsigned_long *)&local_1120);
                if (!bVar4) goto LAB_00163f1c;
                pkVar13 = (key_type *)
                          ((long)&(pkVar13->_M_dataplus)._M_p + (long)&(pkVar11->_M_dataplus)._M_p);
                if (local_1088 != (code *)0x0) {
                  local_1120 = pkVar8;
                  local_10f0[0] = pkVar13;
                  bVar4 = (*local_1080)(&local_1098,(unsigned_long *)local_10f0,
                                        (unsigned_long *)&local_1120);
                  if (!bVar4) goto LAB_00163f1c;
                }
                bVar4 = true;
              }
            } while (bVar4);
            iVar5 = 400;
            if (local_10a8 != (code *)0x0) {
              (*local_10a8)(&local_10b8,&local_10b8,__destroy_functor);
            }
            if (local_1088 != (code *)0x0) {
              (*local_1088)(&local_1098,&local_1098,__destroy_functor);
            }
          }
        }
      }
    }
    if (bVar3 != false) goto LAB_00163f77;
  }
  *local_10c0 = iVar5;
LAB_00163f77:
  if (local_1108 != (code *)0x0) {
    (*local_1108)(&local_1118,&local_1118,__destroy_functor);
  }
  return bVar3;
}

Assistant:

bool read_content(Stream &strm, T &x, size_t payload_max_length, int &status,
                  Progress progress, ContentReceiver receiver) {

  ContentReceiver out = [&](const char *buf, size_t n) {
    return receiver(buf, n);
  };

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
  detail::decompressor decompressor;

  if (!decompressor.is_valid()) {
    status = 500;
    return false;
  }

  if (x.get_header_value("Content-Encoding") == "gzip") {
    out = [&](const char *buf, size_t n) {
      return decompressor.decompress(
          buf, n, [&](const char *buf, size_t n) { return receiver(buf, n); });
    };
  }
#else
  if (x.get_header_value("Content-Encoding") == "gzip") {
    status = 415;
    return false;
  }
#endif

  auto ret = true;
  auto exceed_payload_max_length = false;

  if (is_chunked_transfer_encoding(x.headers)) {
    ret = read_content_chunked(strm, out);
  } else if (!has_header(x.headers, "Content-Length")) {
    ret = read_content_without_length(strm, out);
  } else {
    auto len = get_header_value_uint64(x.headers, "Content-Length", 0);
    if (len > payload_max_length) {
      exceed_payload_max_length = true;
      skip_content_with_length(strm, len);
      ret = false;
    } else if (len > 0) {
      ret = read_content_with_length(strm, len, progress, out);
    }
  }

  if (!ret) { status = exceed_payload_max_length ? 413 : 400; }

  return ret;
}